

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int add_closure_var(JSContext *ctx,JSFunctionDef *s,BOOL is_local,BOOL is_arg,int var_idx,
                   JSAtom var_name,BOOL is_const,BOOL is_lexical,JSVarKindEnum var_kind)

{
  int iVar1;
  JSAtom JVar2;
  JSContext *ctx_00;
  byte in_CL;
  byte in_DL;
  long in_RSI;
  JSContext *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  byte in_stack_00000008;
  byte in_stack_00000010;
  JSClosureVar *cv;
  int in_stack_ffffffffffffffbc;
  undefined1 in_stack_ffffffffffffffc0 [16];
  void **in_stack_ffffffffffffffd0;
  int local_4;
  
  if (*(int *)(in_RSI + 0x198) < 0x10000) {
    iVar1 = js_resize_array((JSContext *)CONCAT44(in_R8D,in_R9D),in_stack_ffffffffffffffd0,
                            in_stack_ffffffffffffffc0._12_4_,in_stack_ffffffffffffffc0._0_8_,
                            in_stack_ffffffffffffffbc);
    if (iVar1 == 0) {
      iVar1 = *(int *)(in_RSI + 0x198);
      *(int *)(in_RSI + 0x198) = iVar1 + 1;
      ctx_00 = (JSContext *)(*(long *)(in_RSI + 0x1a0) + (long)iVar1 * 8);
      *(byte *)&(ctx_00->header).ref_count = (byte)(ctx_00->header).ref_count & 0xfe | in_DL & 1;
      *(byte *)&(ctx_00->header).ref_count =
           (byte)(ctx_00->header).ref_count & 0xfd | (in_CL & 1) << 1;
      *(byte *)&(ctx_00->header).ref_count =
           (byte)(ctx_00->header).ref_count & 0xfb | (in_stack_00000008 & 1) << 2;
      *(byte *)&(ctx_00->header).ref_count =
           (byte)(ctx_00->header).ref_count & 0xf7 | (in_stack_00000010 & 1) << 3;
      *(byte *)&(ctx_00->header).ref_count = (byte)(ctx_00->header).ref_count & 0xf | (char)cv << 4;
      *(short *)((long)&(ctx_00->header).ref_count + 2) = (short)in_R8D;
      JVar2 = JS_DupAtom(ctx_00,in_stack_ffffffffffffffc0._12_4_);
      *(JSAtom *)&(ctx_00->header).field_0x4 = JVar2;
      local_4 = *(int *)(in_RSI + 0x198) + -1;
    }
    else {
      local_4 = -1;
    }
  }
  else {
    JS_ThrowInternalError(in_RDI,"too many closure variables");
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int add_closure_var(JSContext *ctx, JSFunctionDef *s,
                           BOOL is_local, BOOL is_arg,
                           int var_idx, JSAtom var_name,
                           BOOL is_const, BOOL is_lexical,
                           JSVarKindEnum var_kind)
{
    JSClosureVar *cv;

    /* the closure variable indexes are currently stored on 16 bits */
    if (s->closure_var_count >= JS_MAX_LOCAL_VARS) {
        JS_ThrowInternalError(ctx, "too many closure variables");
        return -1;
    }

    if (js_resize_array(ctx, (void **)&s->closure_var,
                        sizeof(s->closure_var[0]),
                        &s->closure_var_size, s->closure_var_count + 1))
        return -1;
    cv = &s->closure_var[s->closure_var_count++];
    cv->is_local = is_local;
    cv->is_arg = is_arg;
    cv->is_const = is_const;
    cv->is_lexical = is_lexical;
    cv->var_kind = var_kind;
    cv->var_idx = var_idx;
    cv->var_name = JS_DupAtom(ctx, var_name);
    return s->closure_var_count - 1;
}